

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O2

void __thiscall HDualRow::rp_hsol_pv_r(HDualRow *this)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  vector<double,_std::allocator<double>_> dse_pv_r;
  value_type_conflict1 local_28;
  
  uVar4 = this->workModel->numTot;
  if ((long)(int)uVar4 < 0x15) {
    dse_pv_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    dse_pv_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    dse_pv_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_28 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&dse_pv_r,(long)(int)uVar4,&local_28);
    iVar1 = this->packCount;
    piVar2 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      dse_pv_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar2[lVar6]] = pdVar3[lVar6];
    }
    uVar5 = 0;
    printf("PvR: Ix  ");
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      printf(" %4d",(ulong)uVar5);
    }
    putchar(10);
    printf("      V  ");
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      printf(" %4.1g",SUB84(dse_pv_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7],0));
    }
    putchar(10);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&dse_pv_r.super__Vector_base<double,_std::allocator<double>_>);
  }
  return;
}

Assistant:

void HDualRow::rp_hsol_pv_r() {
 	//Set limits on problem size for reporting
	const int mx_rp_numTot = 20;
	int numTot = workModel->getNumTot();
	if (numTot>mx_rp_numTot) return;
	vector<double> dse_pv_r;
	dse_pv_r.assign(numTot, 0);
	for (int i = 0; i < packCount; i++) {
		int c_n = packIndex[i];
		dse_pv_r[c_n] = packValue[i];
	}
	printf("PvR: Ix  ");
	for (int i = 0; i < numTot; i++) {
		printf(" %4d", i);
	}
	printf("\n");
	printf("      V  ");
	for (int i = 0; i < numTot; i++) {
		printf(" %4.1g", dse_pv_r[i]);
	}
	printf("\n");

}